

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

int epoll_nochangelist_del(event_base *base,int fd,short old,short events,void *p)

{
  byte bVar1;
  int iVar2;
  undefined1 local_2c [8];
  event_change ch;
  void *p_local;
  short events_local;
  short old_local;
  int fd_local;
  event_base *base_local;
  
  ch.fd._0_1_ = 0;
  local_2c[7] = 0;
  local_2c[6] = 0;
  bVar1 = (byte)events;
  if ((events & 4U) != 0) {
    local_2c[7] = bVar1 & 0x20 | 2;
  }
  if ((events & 2U) != 0) {
    local_2c[6] = bVar1 & 0x20 | 2;
  }
  if ((events & 0x80U) != 0) {
    ch.fd._0_1_ = bVar1 & 0x20 | 2;
  }
  local_2c._0_4_ = fd;
  local_2c._4_2_ = old;
  ch._4_8_ = p;
  iVar2 = epoll_apply_one_change(base,(epollop *)base->evbase,(event_change *)local_2c);
  return iVar2;
}

Assistant:

static int
epoll_nochangelist_del(struct event_base *base, evutil_socket_t fd,
    short old, short events, void *p)
{
	struct event_change ch;
	ch.fd = fd;
	ch.old_events = old;
	ch.read_change = ch.write_change = ch.close_change = 0;
	if (events & EV_WRITE)
		ch.write_change = EV_CHANGE_DEL |
		    (events & EV_ET);
	if (events & EV_READ)
		ch.read_change = EV_CHANGE_DEL |
		    (events & EV_ET);
	if (events & EV_CLOSED)
		ch.close_change = EV_CHANGE_DEL |
		    (events & EV_ET);

	return epoll_apply_one_change(base, base->evbase, &ch);
}